

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

TRef fori_arg(jit_State *J,BCIns *fori,BCReg slot,IRType t,int mode)

{
  TRef TVar1;
  
  TVar1 = J->base[slot];
  if (TVar1 == 0) {
    TVar1 = find_kinit(J,fori,slot,t);
    if (TVar1 == 0) {
      TVar1 = fori_load(J,slot,t,0x30);
      return TVar1;
    }
  }
  return TVar1;
}

Assistant:

static TRef fori_arg(jit_State *J, const BCIns *fori, BCReg slot,
		     IRType t, int mode)
{
  TRef tr = J->base[slot];
  if (!tr) {
    tr = find_kinit(J, fori, slot, t);
    if (!tr)
      tr = fori_load(J, slot, t, mode);
  }
  return tr;
}